

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXParser.cpp
# Opt level: O0

uint64_t Assimp::FBX::ParseTokenAsID(Token *t)

{
  allocator<char> local_41;
  string local_40;
  uint64_t local_20;
  uint64_t i;
  char *err;
  Token *t_local;
  
  err = (char *)t;
  local_20 = ParseTokenAsID(t,(char **)&i);
  if (i != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,(char *)i,&local_41);
    anon_unknown.dwarf_cdd617::ParseError(&local_40,(Token *)err);
  }
  return local_20;
}

Assistant:

uint64_t ParseTokenAsID(const Token& t)
{
    const char* err;
    const uint64_t i = ParseTokenAsID(t,err);
    if(err) {
        ParseError(err,t);
    }
    return i;
}